

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O1

void __thiscall
embree::fast_allocator_regression_test::thread_alloc
          (fast_allocator_regression_test *this,fast_allocator_regression_test *This)

{
  ThreadLocal *pTVar1;
  size_t *psVar2;
  atomic<unsigned_long> *paVar3;
  FastAllocator *this_00;
  iterator __position;
  pointer *pppTVar4;
  size_t i;
  long *plVar5;
  ThreadLocal2 *this_01;
  undefined1 *puVar6;
  ThreadLocal2 *pTVar7;
  size_t sVar8;
  long lVar9;
  pointer *__ptr;
  size_t *ptrs [1000];
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_1fc8;
  char local_1fc0;
  undefined1 local_1fb8 [16];
  ThreadLocal2 *local_1fa8;
  ThreadLocal2 *local_1fa0;
  char local_1f98;
  fast_allocator_regression_test *local_1f90;
  long local_1f88;
  vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
  *local_1f80;
  ThreadLocal2 *local_1f78;
  char local_1f70;
  
  this_00 = (this->alloc)._M_t.
            super___uniq_ptr_impl<embree::FastAllocator,_std::default_delete<embree::FastAllocator>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>
            .super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl;
  plVar5 = (long *)__tls_get_addr(&PTR_02223e08);
  this_01 = (ThreadLocal2 *)*plVar5;
  if (this_01 == (ThreadLocal2 *)0x0) {
    this_01 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
    MutexSys::MutexSys((MutexSys *)this_01);
    (this_01->alloc)._M_b._M_p = (__pointer_type)0x0;
    (this_01->alloc0).parent = this_01;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc1).parent = this_01;
    (this_01->alloc1).ptr = (char *)0x0;
    (this_01->alloc1).cur = 0;
    (this_01->alloc1).end = 0;
    (this_01->alloc1).allocBlockSize = 0;
    (this_01->alloc1).bytesUsed = 0;
    (this_01->alloc1).bytesWasted = 0;
    *plVar5 = (long)this_01;
    local_1f78 = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
    local_1f70 = '\x01';
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    local_1fc8._M_head_impl = this_01;
    std::
    vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
    ::
    emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
              ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                *)FastAllocator::s_thread_local_allocators,
               (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                *)&local_1fc8);
    This = (fast_allocator_regression_test *)local_1fc8._M_head_impl;
    if (local_1fc8._M_head_impl != (ThreadLocal2 *)0x0) {
      std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_1fc8,
                 local_1fc8._M_head_impl);
    }
    if (local_1f70 == '\x01') {
      MutexSys::unlock(&local_1f78->mutex);
    }
  }
  pTVar1 = &this_01->alloc0;
  local_1fb8._8_8_ = &this->barrier;
  local_1f80 = (vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                *)&this_00->thread_local_allocators;
  local_1f88 = 0;
  local_1f90 = this;
  do {
    BarrierSys::wait((BarrierSys *)local_1fb8._8_8_,This);
    lVar9 = 0;
    do {
      local_1fb8._0_8_ = (ulong)((uint)lVar9 & 0x1f) + 8;
      pTVar7 = pTVar1->parent;
      if (this_00 != (pTVar7->alloc)._M_b._M_p) {
        local_1f98 = '\x01';
        local_1fa0 = pTVar7;
        MutexSys::lock(&pTVar7->mutex);
        if ((pTVar7->alloc)._M_b._M_p != (__pointer_type)0x0) {
          LOCK();
          paVar3 = &((pTVar7->alloc)._M_b._M_p)->bytesUsed;
          (paVar3->super___atomic_base<unsigned_long>)._M_i =
               (paVar3->super___atomic_base<unsigned_long>)._M_i +
               (pTVar7->alloc1).bytesUsed + (pTVar7->alloc0).bytesUsed;
          UNLOCK();
          LOCK();
          paVar3 = &((pTVar7->alloc)._M_b._M_p)->bytesFree;
          (paVar3->super___atomic_base<unsigned_long>)._M_i =
               (paVar3->super___atomic_base<unsigned_long>)._M_i +
               (((pTVar7->alloc0).end + (pTVar7->alloc1).end) -
               ((pTVar7->alloc0).cur + (pTVar7->alloc1).cur));
          UNLOCK();
          LOCK();
          paVar3 = &((pTVar7->alloc)._M_b._M_p)->bytesWasted;
          (paVar3->super___atomic_base<unsigned_long>)._M_i =
               (paVar3->super___atomic_base<unsigned_long>)._M_i +
               (pTVar7->alloc1).bytesWasted + (pTVar7->alloc0).bytesWasted;
          UNLOCK();
        }
        (pTVar7->alloc0).bytesUsed = 0;
        (pTVar7->alloc0).bytesWasted = 0;
        (pTVar7->alloc0).end = 0;
        (pTVar7->alloc0).allocBlockSize = 0;
        (pTVar7->alloc0).ptr = (char *)0x0;
        (pTVar7->alloc0).cur = 0;
        if (this_00 == (FastAllocator *)0x0) {
          (pTVar7->alloc1).bytesUsed = 0;
          (pTVar7->alloc1).bytesWasted = 0;
          (pTVar7->alloc1).end = 0;
          (pTVar7->alloc1).allocBlockSize = 0;
          (pTVar7->alloc1).ptr = (char *)0x0;
          (pTVar7->alloc1).cur = 0;
        }
        else {
          (pTVar7->alloc0).allocBlockSize = this_00->defaultBlockSize;
          (pTVar7->alloc1).ptr = (char *)0x0;
          (pTVar7->alloc1).cur = 0;
          (pTVar7->alloc1).end = 0;
          (pTVar7->alloc1).allocBlockSize = 0;
          (pTVar7->alloc1).bytesUsed = 0;
          (pTVar7->alloc1).bytesWasted = 0;
          (pTVar7->alloc1).allocBlockSize = this_00->defaultBlockSize;
        }
        LOCK();
        (pTVar7->alloc)._M_b._M_p = this_00;
        UNLOCK();
        local_1fc8._M_head_impl = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
        local_1fc0 = '\x01';
        local_1fa8 = pTVar7;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        __position._M_current =
             *(pointer *)
              ((long)&(this_00->thread_local_allocators).
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              + 8);
        if (__position._M_current ==
            *(pointer *)
             ((long)&(this_00->thread_local_allocators).
                     super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             + 0x10)) {
          std::
          vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
          ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                    (local_1f80,__position,&local_1fa8);
        }
        else {
          *__position._M_current = local_1fa8;
          pppTVar4 = (pointer *)
                     ((long)&(this_00->thread_local_allocators).
                             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                     + 8);
          *pppTVar4 = *pppTVar4 + 1;
        }
        if (local_1fc0 == '\x01') {
          MutexSys::unlock(&(local_1fc8._M_head_impl)->mutex);
        }
        if (local_1f98 == '\x01') {
          MutexSys::unlock(&local_1fa0->mutex);
        }
      }
      psVar2 = &(this_01->alloc0).bytesUsed;
      *psVar2 = (size_t)(*psVar2 + local_1fb8._0_8_);
      sVar8 = (this_01->alloc0).cur;
      This = (fast_allocator_regression_test *)(ulong)(-(int)sVar8 & 0xf);
      puVar6 = (undefined1 *)
               (local_1fb8._0_8_ +
               (long)((long)&((RegressionTest *)&((ThreadLocal2 *)This)->mutex)->
                             _vptr_RegressionTest + sVar8));
      (this_01->alloc0).cur = (size_t)puVar6;
      if ((undefined1 *)(this_01->alloc0).end < puVar6) {
        (this_01->alloc0).cur = sVar8;
        pTVar7 = (ThreadLocal2 *)(this_01->alloc0).allocBlockSize;
        if (pTVar7 < (ThreadLocal2 *)(local_1fb8._0_8_ << 2)) {
          This = (fast_allocator_regression_test *)local_1fb8;
          pTVar7 = (ThreadLocal2 *)FastAllocator::malloc(this_00,(size_t)This);
        }
        else {
          local_1fc8._M_head_impl = pTVar7;
          pTVar7 = (ThreadLocal2 *)FastAllocator::malloc(this_00,(size_t)&local_1fc8);
          (this_01->alloc0).ptr = (char *)pTVar7;
          sVar8 = ((this_01->alloc0).end - (this_01->alloc0).cur) + (this_01->alloc0).bytesWasted;
          (this_01->alloc0).bytesWasted = sVar8;
          (this_01->alloc0).cur = 0;
          (this_01->alloc0).end = (size_t)local_1fc8._M_head_impl;
          (this_01->alloc0).cur = local_1fb8._0_8_;
          if (local_1fc8._M_head_impl < (ulong)local_1fb8._0_8_) {
            (this_01->alloc0).cur = 0;
            local_1fc8._M_head_impl = (ThreadLocal2 *)(this_01->alloc0).allocBlockSize;
            pTVar7 = (ThreadLocal2 *)FastAllocator::malloc(this_00,(size_t)&local_1fc8);
            (this_01->alloc0).ptr = (char *)pTVar7;
            sVar8 = ((this_01->alloc0).end - (this_01->alloc0).cur) + (this_01->alloc0).bytesWasted;
            (this_01->alloc0).bytesWasted = sVar8;
            (this_01->alloc0).cur = 0;
            (this_01->alloc0).end = (size_t)local_1fc8._M_head_impl;
            (this_01->alloc0).cur = local_1fb8._0_8_;
            if (local_1fc8._M_head_impl < (ulong)local_1fb8._0_8_) {
              (this_01->alloc0).cur = 0;
              pTVar7 = (ThreadLocal2 *)0x0;
              This = (fast_allocator_regression_test *)local_1fb8._0_8_;
              goto LAB_00a1b265;
            }
          }
          (this_01->alloc0).bytesWasted = sVar8;
          This = (fast_allocator_regression_test *)local_1fb8._0_8_;
        }
      }
      else {
        psVar2 = &(this_01->alloc0).bytesWasted;
        *psVar2 = (size_t)((long)&((RegressionTest *)&((ThreadLocal2 *)This)->mutex)->
                                  _vptr_RegressionTest + *psVar2);
        pTVar7 = (ThreadLocal2 *)(puVar6 + ((long)(this_01->alloc0).ptr - local_1fb8._0_8_));
      }
LAB_00a1b265:
      (&local_1f78)[lVar9] = pTVar7;
      (pTVar7->mutex).mutex = (void *)((long)&pTVar1->parent + lVar9);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 1000);
    lVar9 = 0;
    do {
      if ((void *)((long)&pTVar1->parent + lVar9) != ((&local_1f78)[lVar9]->mutex).mutex) {
        LOCK();
        (local_1f90->numFailed).super___atomic_base<unsigned_long>._M_i =
             (local_1f90->numFailed).super___atomic_base<unsigned_long>._M_i + 1;
        UNLOCK();
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 1000);
    BarrierSys::wait((BarrierSys *)local_1fb8._8_8_,This);
    local_1f88 = local_1f88 + 1;
    if (local_1f88 == 1000) {
      return;
    }
  } while( true );
}

Assistant:

static void thread_alloc(fast_allocator_regression_test* This)
    {
      FastAllocator::CachedAllocator threadalloc = This->alloc->getCachedAllocator();

      size_t* ptrs[1000];
      for (size_t j=0; j<1000; j++)
      {
        This->barrier.wait();
        for (size_t i=0; i<1000; i++) {
          ptrs[i] = (size_t*) threadalloc.malloc0(sizeof(size_t)+(i%32));
          *ptrs[i] = size_t(threadalloc.talloc0) + i;
        }
        for (size_t i=0; i<1000; i++) {
          if (*ptrs[i] != size_t(threadalloc.talloc0) + i) 
            This->numFailed++;
        }
        This->barrier.wait();
      }
    }